

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O0

value value_container(void *data)

{
  void *data_local;
  value local_8;
  
  local_8 = data;
  if (data == (void *)0x0) {
    local_8 = (value)0x0;
  }
  return local_8;
}

Assistant:

value value_container(void *data)
{
	if (data == NULL)
	{
		return NULL;
	}

	/* Right now the memory layout is designed in a way that
	* the first byte of the value is the data itself, so returning
	* the data as (value) has the same effect as container_of(data, struct value, data)
	*/
	return (value)data;
}